

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

int __thiscall deqp::gls::ub::UniformLayout::getBlockIndex(UniformLayout *this,char *name)

{
  int iVar1;
  pointer pBVar2;
  long lVar3;
  long lVar4;
  
  pBVar2 = (this->blocks).
           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->blocks).
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 6)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      iVar1 = std::__cxx11::string::compare((char *)((long)&(pBVar2->name)._M_dataplus + lVar4));
      if (iVar1 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pBVar2 = (this->blocks).
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x40;
    } while (lVar3 < (int)((ulong)((long)(this->blocks).
                                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2)
                          >> 6));
  }
  return -1;
}

Assistant:

int UniformLayout::getBlockIndex (const char* name) const
{
	for (int ndx = 0; ndx < (int)blocks.size(); ndx++)
	{
		if (blocks[ndx].name == name)
			return ndx;
	}
	return -1;
}